

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * chapter2::pent_series(int pos)

{
  pointer piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int local_2c;
  
  if (pent_series(int)::elem == '\0') {
    pent_series();
  }
  if ((uint)pos < 0x41) {
    uVar2 = (long)pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    iVar4 = (int)uVar2;
    iVar3 = iVar4 + 1;
    if (iVar3 <= pos && uVar2 < (uint)pos) {
      iVar4 = iVar4 * 3 + 2;
      piVar1 = pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      do {
        local_2c = (iVar4 * iVar3) / 2;
        if (pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish == piVar1) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&pent_series::elem,
                     (iterator)
                     pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c);
          piVar1 = pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c;
          pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar3 = iVar3 + 1;
        iVar4 = iVar4 + 3;
      } while (iVar3 <= pos);
    }
  }
  return &pent_series::elem;
}

Assistant:

const vector<int> * pent_series(int pos) {
        static vector<int> elem;
        if (check_validity(pos) && pos > elem.size()) {
            for (int ix = static_cast<int>(elem.size() + 1); ix <= pos; ++ix) {
                elem.push_back(ix * (3 * ix - 1) / 2);
            }
        }

        return &elem;
    }